

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O0

JL_STATUS ProcessListOnStack(ProcessStack *Stack,uint32_t *pStackDepth,JlBuffer *JsonBuffer,
                            JL_OUTPUT_FLAGS OutputFlags)

{
  JL_DATA_TYPE JVar1;
  uint32_t *__s;
  ProcessStack *newItem;
  JlDataObject *nextObject;
  ProcessStack *currentItem;
  JL_OUTPUT_FLAGS JStack_28;
  JL_STATUS jlStatus;
  JL_OUTPUT_FLAGS OutputFlags_local;
  JlBuffer *JsonBuffer_local;
  uint32_t *pStackDepth_local;
  ProcessStack *Stack_local;
  
  nextObject = (JlDataObject *)(Stack + *pStackDepth);
  currentItem._4_4_ = JL_STATUS_SUCCESS;
  JStack_28 = OutputFlags;
  OutputFlags_local = (JL_OUTPUT_FLAGS)JsonBuffer;
  JsonBuffer_local = (JlBuffer *)pStackDepth;
  pStackDepth_local = (uint32_t *)Stack;
  if ((*(_Bool *)((long)&nextObject->Tag + 4) & 1U) == 0) {
    currentItem._4_4_ = OutputListStart(JsonBuffer,OutputFlags,*pStackDepth);
    *(undefined1 *)((long)&nextObject->Tag + 4) = 1;
    (nextObject->field_2).String = (char *)0x0;
  }
  if (currentItem._4_4_ == JL_STATUS_SUCCESS) {
    newItem = (ProcessStack *)0x0;
    currentItem._4_4_ =
         JlGetObjectListNextItem
                   (*(JlDataObject **)nextObject,(JlDataObject **)&newItem,
                    (JlListItem **)&(nextObject->field_2).String);
    if (currentItem._4_4_ == JL_STATUS_SUCCESS) {
      __s = pStackDepth_local + (ulong)((int)JsonBuffer_local->BufferUsed + 1) * 6;
      memset(__s,0,0x18);
      *(ProcessStack **)__s = newItem;
      JVar1 = JlGetObjectType((JlDataObject *)newItem);
      __s[2] = JVar1;
      *(int *)&JsonBuffer_local->BufferUsed = (int)JsonBuffer_local->BufferUsed + 1;
      if ((nextObject->Tag & 0x10000000000) != 0) {
        currentItem._4_4_ =
             OutputListBetween((JlBuffer *)OutputFlags_local,JStack_28,
                               (uint32_t)JsonBuffer_local->BufferUsed);
      }
      *(undefined1 *)((long)&nextObject->Tag + 5) = 1;
    }
    else if (currentItem._4_4_ == JL_STATUS_END_OF_DATA) {
      if (((JStack_28 & 0x10) != 0) && ((nextObject->Tag & 0x10000000000) != 0)) {
        JlBufferAdd((JlBuffer *)OutputFlags_local,",",1);
      }
      currentItem._4_4_ =
           OutputListEnd((JlBuffer *)OutputFlags_local,JStack_28,
                         (uint32_t)JsonBuffer_local->BufferUsed);
      *(int *)&JsonBuffer_local->BufferUsed = (int)JsonBuffer_local->BufferUsed + -1;
    }
  }
  return currentItem._4_4_;
}

Assistant:

JL_STATUS
    ProcessListOnStack
    (
        ProcessStack*       Stack,
        uint32_t*           pStackDepth,
        JlBuffer*           JsonBuffer,
        JL_OUTPUT_FLAGS     OutputFlags
    )
{
    JL_STATUS jlStatus;
    ProcessStack* currentItem = &Stack[*pStackDepth];

    jlStatus = JL_STATUS_SUCCESS;

    if( !currentItem->StartedEnumerating )
    {
        // Start a list
        jlStatus = OutputListStart( JsonBuffer, OutputFlags, *pStackDepth );
        currentItem->StartedEnumerating = true;
        currentItem->ListEnumerator = NULL;
    }

    if( JL_STATUS_SUCCESS == jlStatus )
    {
        // Add next list item to stack
        JlDataObject* nextObject = NULL;
        jlStatus = JlGetObjectListNextItem( currentItem->Object, &nextObject, &currentItem->ListEnumerator );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            // Add item to stack
            ProcessStack* newItem = &Stack[*pStackDepth+1];
            memset( newItem, 0, sizeof(ProcessStack) );
            newItem->Object = nextObject;
            newItem->ObjectType = JlGetObjectType( nextObject );
            *pStackDepth += 1;

            if( currentItem->ProcessedFirstItem )
            {
                // Need to add a comma.
                jlStatus = OutputListBetween( JsonBuffer, OutputFlags, *pStackDepth );
            }
            currentItem->ProcessedFirstItem = true;
        }
        else if( JL_STATUS_END_OF_DATA == jlStatus )
        {
            // End list
            if( OutputFlags & JL_OUTPUT_FLAGS_J5_TRAILING_COMMAS && currentItem->ProcessedFirstItem )
            {
                // Add trailing comma
                (void) JlBufferAdd( JsonBuffer, ",", 1 );
            }
            jlStatus = OutputListEnd( JsonBuffer, OutputFlags, *pStackDepth );
            *pStackDepth -=1;
        }
    }

    return jlStatus;
}